

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O3

void __thiscall soplex::SoPlexBase<double>::_verifyObjLimitReal(SoPlexBase<double> *this)

{
  Verbosity VVar1;
  ostream *poVar2;
  char cVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  Verbosity old_verbosity;
  Real RVar8;
  double redcostviol;
  double dualviol;
  double sumviol;
  double local_38;
  double local_30;
  double local_28;
  
  VVar1 = (this->spxout).m_verbosity;
  if (2 < (int)VVar1) {
    (this->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[3]," --- verifying objective limit",0x1e);
    poVar2 = (this->spxout).m_streams[(this->spxout).m_verbosity];
    cVar3 = (char)poVar2;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    (this->spxout).m_verbosity = VVar1;
  }
  local_28 = 0.0;
  local_30 = 0.0;
  local_38 = 0.0;
  bVar6 = getDualViolation(this,&local_30,&local_28);
  bVar7 = getRedCostViolation(this,&local_38,&local_28);
  dVar5 = local_30;
  if ((((bVar6) && (bVar7)) &&
      (RVar8 = Tolerances::floatingPointOpttol
                         ((this->_solver).super_SPxLPBase<double>._tolerances.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      , dVar4 = local_38, dVar5 < RVar8)) &&
     (RVar8 = Tolerances::floatingPointOpttol
                        ((this->_solver).super_SPxLPBase<double>._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr),
     dVar4 < RVar8)) {
    return;
  }
  VVar1 = (this->spxout).m_verbosity;
  if ((int)VVar1 < 5) {
    if ((int)VVar1 < 3) goto LAB_0033e738;
  }
  else {
    (this->spxout).m_verbosity = INFO3;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[5],", dual violation: ",0x12);
    std::ostream::_M_insert<double>(local_30);
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[(this->spxout).m_verbosity],", redcost violation: ",0x15);
    std::ostream::_M_insert<double>(local_38);
    poVar2 = (this->spxout).m_streams[(this->spxout).m_verbosity];
    cVar3 = (char)poVar2;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
  }
  (this->spxout).m_verbosity = INFO1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((this->spxout).m_streams[3],
             " --- detected violations in original problem space -- solve again without presolving/scaling"
             ,0x5c);
  poVar2 = (this->spxout).m_streams[(this->spxout).m_verbosity];
  cVar3 = (char)poVar2;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  (this->spxout).m_verbosity = VVar1;
LAB_0033e738:
  if (this->_simplifier == (SPxSimplifier<double> *)0x0 && this->_scaler == (SPxScaler<double> *)0x0
     ) {
    (this->_solver).useTerminationValue = false;
  }
  else if (this->_isRealLPScaled == true) {
    SPxSolverBase<double>::unscaleLPandReloadBasis(&this->_solver);
    this->_isRealLPScaled = false;
    this->_unscaleCalls = this->_unscaleCalls + 1;
  }
  _preprocessAndSolveReal(this,false,(bool *)0x0);
  return;
}

Assistant:

void SoPlexBase<R>::_verifyObjLimitReal()
{
   SPX_MSG_INFO1(spxout, spxout << " --- verifying objective limit" << std::endl;)

   R sumviol = 0;
   R dualviol = 0;
   R redcostviol = 0;

   bool dualfeasible = true;

   if(!getDualViolation(dualviol, sumviol))
      dualfeasible = false;

   if(!getRedCostViolation(redcostviol, sumviol))
      dualfeasible = false;

   if(!dualfeasible || dualviol >= _solver.tolerances()->floatingPointOpttol()
         || redcostviol >= _solver.tolerances()->floatingPointOpttol())
   {
      assert(&_solver == _realLP);
      assert(_isRealLPLoaded);
      SPX_MSG_INFO3(spxout, spxout << ", dual violation: " << dualviol
                    << ", redcost violation: " << redcostviol << std::endl;)
      SPX_MSG_INFO1(spxout, spxout <<
                    " --- detected violations in original problem space -- solve again without presolving/scaling" <<
                    std::endl;)

      // if we already disabled simplifier and scaler, next disable the objective limit
      if(_scaler == nullptr && _simplifier == nullptr)
      {
         _solver.toggleTerminationValue(false);
      }
      else if(_isRealLPScaled)
      {
         _solver.unscaleLPandReloadBasis();
         _isRealLPScaled = false;
         ++_unscaleCalls;
      }

      _preprocessAndSolveReal(false);
   }
}